

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

bool Geometry::OnLine(Point *p,Line *l)

{
  Point *pPVar1;
  bool bVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  Point PStack_148;
  Point local_138;
  Point local_128;
  Point local_118;
  Point local_108;
  Point local_f8;
  Point local_e8;
  Point local_d8;
  Point local_c8;
  Point local_b8;
  Point local_a8;
  Point local_98;
  Point local_88;
  Point local_78;
  Point local_68;
  Point local_58;
  Point local_48;
  Point local_38;
  
  local_38.x = (l->a).x;
  local_38.y = (l->a).y;
  local_48.x = p->x;
  local_48.y = p->y;
  operator-((Geometry *)&local_f8,&local_38,&local_48);
  local_58.x = (l->b).x;
  local_58.y = (l->b).y;
  local_68.x = p->x;
  local_68.y = p->y;
  operator-((Geometry *)&local_108,&local_58,&local_68);
  dVar4 = operator*(&local_f8,&local_108);
  if (dVar4 < -1e-08 != dVar4 <= 1e-08) {
    local_78.x = p->x;
    local_78.y = p->y;
    local_88.x = (l->a).x;
    local_88.y = (l->a).y;
    operator-((Geometry *)&local_118,&local_78,&local_88);
    pPVar1 = &l->b;
    local_98.x = pPVar1->x;
    local_98.y = (l->b).y;
    local_a8.x = (l->a).x;
    local_a8.y = (l->a).y;
    operator-((Geometry *)&local_128,&local_98,&local_a8);
    dVar5 = operator^(&local_118,&local_128);
    if ((1e-08 < dVar5) || (-1e-08 <= dVar5)) {
      local_b8.x = p->x;
      local_b8.y = p->y;
      local_c8.x = pPVar1->x;
      local_c8.y = (l->b).y;
      operator-((Geometry *)&local_138,&local_b8,&local_c8);
      local_d8.x = (l->a).x;
      local_d8.y = (l->a).y;
      local_e8.x = pPVar1->x;
      local_e8.y = (l->b).y;
      operator-((Geometry *)&PStack_148,&local_d8,&local_e8);
      dVar5 = operator^(&local_138,&PStack_148);
      bVar3 = -(-1e-08 <= dVar5) | -(1e-08 < dVar5);
      bVar2 = true;
      goto LAB_00106500;
    }
  }
  bVar2 = false;
  bVar3 = 0;
LAB_00106500:
  if (bVar2) {
    Point::~Point(&PStack_148);
    Point::~Point(&local_e8);
    Point::~Point(&local_d8);
    Point::~Point(&local_138);
    Point::~Point(&local_c8);
    Point::~Point(&local_b8);
  }
  if (dVar4 < -1e-08 != dVar4 <= 1e-08) {
    Point::~Point(&local_128);
    Point::~Point(&local_a8);
    Point::~Point(&local_98);
    Point::~Point(&local_118);
    Point::~Point(&local_88);
    Point::~Point(&local_78);
  }
  Point::~Point(&local_108);
  Point::~Point(&local_68);
  Point::~Point(&local_58);
  Point::~Point(&local_f8);
  Point::~Point(&local_48);
  Point::~Point(&local_38);
  return (bool)(bVar3 & 1);
}

Assistant:

bool OnLine(Point p, Line l){
		return sgn((l.a - p) * (l.b - p)) == 0 && sgn((p - l.a) ^ (l.b - l.a)) >= 0 && sgn((p - l.b) ^ (l.a - l.b)) >= 0;
	}